

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cpp
# Opt level: O0

void __thiscall
r_memory_map::r_memory_map
          (r_memory_map *this,int fd,uint64_t offset,uint64_t len,uint32_t prot,uint32_t flags,
          uint64_t mapOffset)

{
  size_t __len;
  int __prot;
  int __flags;
  runtime_error *prVar1;
  void *pvVar2;
  uint32_t flags_local;
  uint32_t prot_local;
  uint64_t len_local;
  uint64_t offset_local;
  int fd_local;
  r_memory_map *this_local;
  
  this->_vptr_r_memory_map = (_func_int **)&PTR__r_memory_map_00123d50;
  this->_mem = (void *)0x0;
  this->_length = len;
  this->_mapOffset = mapOffset;
  if (fd < 1) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar1,"Attempting to memory map a bad file descriptor.");
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (len == 0) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar1,"Attempting to memory map 0 bytes is invalid.");
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (((flags & 1) == 0) && ((flags & 2) == 0)) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar1,
               "A mapping must be either a file mapping, or an anonymous mapping (neither was specified)."
              );
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((flags & 0x10) != 0) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar1,"r_memory_map does not support fixed mappings.");
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __len = this->_length;
  __prot = _get_posix_prot_flags(this,prot);
  __flags = _get_posix_access_flags(this,flags);
  pvVar2 = mmap64((void *)0x0,__len,__prot,__flags,fd,offset);
  this->_mem = pvVar2;
  return;
}

Assistant:

r_memory_map::r_memory_map(int fd, uint64_t offset, uint64_t len, uint32_t prot, uint32_t flags, uint64_t mapOffset) :
    _mem(NULL),
    _length(len),
    _mapOffset(mapOffset)
{
    if(fd <= 0)
        throw runtime_error("Attempting to memory map a bad file descriptor.");

    if(len == 0)
        throw runtime_error("Attempting to memory map 0 bytes is invalid.");

    if(!(flags & MM_TYPE_FILE) && !(flags & MM_TYPE_ANON))
        throw runtime_error("A mapping must be either a file mapping, or an anonymous mapping (neither was specified).");

    if(flags & MM_FIXED)
        throw runtime_error("r_memory_map does not support fixed mappings.");

    _mem = mmap64(NULL, _length, _get_posix_prot_flags(prot), _get_posix_access_flags(flags), fd, offset);
}